

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall
imrt::ApertureILS::improvementIntensity
          (ApertureILS *this,int beamlet,Station *station,bool open_beamlet,double c_eval,Plan *P,
          bool best_improvement)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  byte in_CL;
  Plan *in_RDX;
  byte in_R9B;
  double in_XMM0_Qa;
  vector<int,_std::allocator<int>_> a_list;
  bool flag;
  int i;
  int local_res168;
  int a;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double aux_eval;
  double local_best;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffe30;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff_00;
  Station *in_stack_fffffffffffffe38;
  Plan *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe60;
  Station *in_stack_fffffffffffffe68;
  double in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  Station *in_stack_fffffffffffffee8;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<int,_std::allocator<int>_> local_90;
  byte local_75;
  int local_74;
  int local_70;
  int local_6c;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_68;
  double local_50;
  double local_48;
  byte local_39;
  double local_30;
  byte local_21;
  Plan *local_20;
  double local_8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_21 = in_CL & 1;
  local_39 = in_R9B & 1;
  local_48 = -1.0;
  local_50 = 0.0;
  local_30 = in_XMM0_Qa;
  local_20 = in_RDX;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16bba0);
  local_75 = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16bbb5);
  Station::getOpen(in_stack_fffffffffffffe68,iVar1);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe38);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_90);
  if (sVar2 == 0) {
    std::operator<<((ostream *)&std::cout,"[NOPT] ");
    local_8 = local_30;
  }
  else {
    iVar1 = rand();
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_90);
    local_6c = (int)((ulong)(long)iVar1 % sVar2);
    local_74 = 0;
    while ((local_75 & 1) != 0) {
      if ((local_21 & 1) == 0) {
        std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_6c);
        Station::modifyIntensityAperture_abi_cxx11_
                  (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe40,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe38);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x16bdfc);
        local_50 = Plan::incremental_eval
                             (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe30);
      }
      else {
        std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_6c);
        Station::modifyIntensityAperture_abi_cxx11_
                  (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe40,
                  (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  in_stack_fffffffffffffe38);
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   0x16bd48);
        local_50 = Plan::incremental_eval
                             (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe30);
      }
      if ((local_48 < 0.0) || (1e-05 < local_48 - local_50)) {
        local_48 = local_50;
        local_70 = local_6c;
        local_74 = 0;
        if ((local_39 & 1) == 0) {
          local_8 = local_50;
          goto LAB_0016c11e;
        }
      }
      Station::undoLast_abi_cxx11_
                ((Station *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe40,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe38);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16beed)
      ;
      sVar2 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
              size(in_stack_fffffffffffffe30);
      if (sVar2 != 0) {
        local_50 = Plan::incremental_eval
                             (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe30);
      }
      local_74 = local_74 + 1;
      local_6c = local_6c + 1;
      sVar2 = (size_type)local_6c;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_90);
      if (sVar2 == sVar3) {
        local_6c = 0;
      }
      sVar2 = (size_type)local_74;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_90);
      if (sVar2 == sVar3) {
        local_75 = 0;
      }
    }
    if ((local_21 & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_70);
      Station::modifyIntensityAperture_abi_cxx11_
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe40,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe38);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16c033)
      ;
      local_48 = Plan::incremental_eval
                           (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                            in_stack_fffffffffffffe30);
    }
    else {
      std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_70);
      Station::modifyIntensityAperture_abi_cxx11_
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
      diff_00 = &local_68;
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      operator=((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_20,
                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                in_stack_fffffffffffffe38);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16c0d0)
      ;
      local_48 = Plan::incremental_eval(local_20,in_stack_fffffffffffffe38,diff_00);
      in_stack_fffffffffffffe40 = local_20;
    }
    local_8 = local_48;
  }
LAB_0016c11e:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x16c138);
  return local_8;
}

Assistant:

double ApertureILS::improvementIntensity(int beamlet, Station& station, bool open_beamlet, 
                                         double c_eval, Plan & P, bool best_improvement) {
  
  double local_best =-1, aux_eval=0;
  list<pair<int, double> > diff;
  int a, local_a, i;
  bool flag = true;
  vector<int> a_list;
  
  a_list = station.getOpen(beamlet);
  
  if (a_list.size()<1) {
    //cout << endl << "Warning: not possible to make intensity change beamlet:" << beamlet <<endl;
    cout << "[NOPT] ";
    return(c_eval);
  }
  
  a = (int)rand() % a_list.size();
  i=0;

  // Check every aperture 
  while(flag) {
    if (open_beamlet) {
      diff = station.modifyIntensityAperture(a_list[a], step_intensity);
      aux_eval = P.incremental_eval(station, diff);
      //cout << endl<<"  Increasing intensity aperture: " << a <<" eval: " << aux_eval << " list: ";
      //for (list<pair<int,double> >::iterator it=aux_diff.begin();it!=aux_diff.end();it++) cout << it->first << " ";
      //cout << endl;
    } else {
      diff = station.modifyIntensityAperture(a_list[a], -step_intensity);
      aux_eval = P.incremental_eval(station, diff);
      //cout << endl<< "  Reducing intensity aperture: " << a <<" eval: " << aux_eval <<  " list: ";
      //for (list<pair<int,double> >::iterator it=aux_diff.begin();it!=aux_diff.end();it++) cout << it->first << " ";
      //cout << endl;
    }
    
    // First improvement
    if (local_best < 0 || (local_best- aux_eval)>0.00001){
      local_best=aux_eval;
      local_a=a;
      i=0; // to support best improvement
      if (!best_improvement)
        return(local_best);
    } 
    
    //Undo change
    diff = station.undoLast();
    if (diff.size()>0)
      aux_eval = P.incremental_eval(station, diff);
    
    i++;
    a++;
    if (a==a_list.size()) a=0;
    if (i==a_list.size()) flag=false;
  }
  
  // If no improvement was found, return the best solution found.
  if (!open_beamlet) {
    diff = station.modifyIntensityAperture(a_list[local_a], 1);
    local_best = P.incremental_eval(station, diff);
  } else{
    diff = station.modifyIntensityAperture(a_list[local_a], -1);
    local_best = P.incremental_eval(station, diff);
  }
  return(local_best);
}